

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O1

void __thiscall
GdlGlyphDefn::AssignGlyphAttrsToClassMembers
          (GdlGlyphDefn *this,GrcGlyphAttrMatrix *pgax,GdlRenderer *prndr,
          GrcLigComponentList *plclist,
          vector<GdlGlyphAttrSetting_*,_std::allocator<GdlGlyphAttrSetting_*>_> *vpglfaAttrs,
          int cgid,int *igid)

{
  gid16 wGlyphID;
  GrcSymbolTableEntry *this_00;
  GdlAssignment *pGVar1;
  bool bVar2;
  int iVar3;
  pointer ppGVar4;
  GdlExpression *pGVar5;
  undefined4 extraout_var;
  GdlExpression *pexp;
  pointer puVar6;
  undefined4 extraout_var_00;
  long lVar7;
  Symbol psymComponent;
  ulong uVar8;
  bool fOverrideOld;
  bool fShadow;
  int local_fc;
  int local_f8;
  ExpressionType local_f4;
  int local_f0;
  int local_ec;
  GdlExpression *local_e8;
  GrcGlyphAttrMatrix *local_e0;
  GrpLineAndFile lnfOld;
  string local_b0;
  vector<GdlGlyphAttrSetting_*,_std::allocator<GdlGlyphAttrSetting_*>_> *local_90;
  ulong local_88;
  GdlRenderer *local_80;
  GrcLigComponentList *local_78;
  ulong local_70;
  GdlExpression *pexpOld;
  int mPrUnitsOld;
  int nPROld;
  GrpLineAndFile lnfNew;
  
  ppGVar4 = (vpglfaAttrs->
            super__Vector_base<GdlGlyphAttrSetting_*,_std::allocator<GdlGlyphAttrSetting_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((vpglfaAttrs->
      super__Vector_base<GdlGlyphAttrSetting_*,_std::allocator<GdlGlyphAttrSetting_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppGVar4) {
    local_f0 = *igid;
    uVar8 = 0;
    local_f4 = cgid;
    local_e0 = pgax;
    local_90 = vpglfaAttrs;
    local_80 = prndr;
    local_78 = plclist;
    do {
      this_00 = ppGVar4[uVar8]->m_psym;
      local_f8 = this_00->m_nInternalID;
      if ((g_cman.m_fOffsetAttrs != false) ||
         (bVar2 = GrcSymbolTableEntry::IsIgnorableOffsetAttr(this_00), !bVar2)) {
        pGVar1 = (vpglfaAttrs->
                 super__Vector_base<GdlGlyphAttrSetting_*,_std::allocator<GdlGlyphAttrSetting_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar8]->m_pasgn;
        pexp = (pGVar1->super_GrcAssignment).m_pexp;
        local_ec = (pGVar1->super_GrcAssignment).m_nPointRadius;
        local_70 = (ulong)(uint)(pGVar1->super_GrcAssignment).m_mPrUnits;
        bVar2 = (pGVar1->super_GrcAssignment).m_fOverride;
        GrpLineAndFile::GrpLineAndFile(&lnfNew,&(pGVar1->super_GrcAssignment).m_lnf);
        local_fc = lnfNew.m_nLinePre;
        if (pexp == (GdlExpression *)0x0) {
          pGVar5 = (GdlExpression *)0x0;
        }
        else {
          pGVar5 = (GdlExpression *)
                   __dynamic_cast(pexp,&GdlExpression::typeinfo,&GdlClassMemberExpression::typeinfo,
                                  0);
        }
        local_88 = uVar8;
        if (pGVar5 == (GdlExpression *)0x0) {
          local_e8 = (GdlExpression *)0x0;
        }
        else {
          pGVar5[1].m_exptResult = local_f4;
          iVar3 = *(int *)((long)&pGVar5[1].super_GdlObject.m_lnf.m_staFile.field_2 + 0xc);
          if ((iVar3 != -1) && (iVar3 != *igid)) {
            iVar3 = (**pGVar5->_vptr_GdlExpression)();
            if (CONCAT44(extraout_var,iVar3) == 0) {
              pexp = (GdlExpression *)0x0;
            }
            else {
              pexp = (GdlExpression *)
                     __dynamic_cast(CONCAT44(extraout_var,iVar3),&GdlExpression::typeinfo,
                                    &GdlClassMemberExpression::typeinfo,0);
            }
            GrcManager::StoreModifiedExpression(&g_cman,pexp);
            pGVar5 = pexp;
          }
          *(int *)((long)&pGVar5[1].super_GdlObject.m_lnf.m_staFile.field_2 + 0xc) = *igid;
          local_e8 = pGVar5;
        }
        *igid = local_f0;
        puVar6 = (this->m_vwGlyphIDs).
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->m_vwGlyphIDs).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
            ._M_impl.super__Vector_impl_data._M_finish != puVar6) {
          uVar8 = 0;
          do {
            if (puVar6[uVar8] != 0xfffb) {
              lnfOld.m_nLinePre = -1;
              lnfOld.m_nLineOrig = -1;
              lnfOld.m_staFile._M_dataplus._M_p = (pointer)&lnfOld.m_staFile.field_2;
              lnfOld.m_staFile._M_string_length = 0;
              lnfOld.m_staFile.field_2._M_local_buf[0] = '\0';
              GrcGlyphAttrMatrix::Get
                        (local_e0,puVar6[uVar8],local_f8,0,&pexpOld,&nPROld,&mPrUnitsOld,
                         &fOverrideOld,&fShadow,&lnfOld);
              if (((pexpOld == (GdlExpression *)0x0) ||
                  ((lnfOld.m_nLinePre < local_fc & bVar2) != 0)) ||
                 ((local_fc < lnfOld.m_nLinePre && (fOverrideOld == false)))) {
                pGVar5 = pexp;
                if ((local_e8 != (GdlExpression *)0x0) &&
                   (*(int *)((long)&local_e8[1].super_GdlObject.m_lnf.m_staFile.field_2 + 0xc) !=
                    *igid)) {
                  iVar3 = (**pexp->_vptr_GdlExpression)(pexp);
                  pGVar5 = (GdlExpression *)CONCAT44(extraout_var_00,iVar3);
                  lVar7 = __dynamic_cast(pGVar5,&GdlExpression::typeinfo,
                                         &GdlClassMemberExpression::typeinfo,0);
                  *(int *)(lVar7 + 100) = *igid;
                  GrcManager::StoreModifiedExpression(&g_cman,pGVar5);
                }
                GrcGlyphAttrMatrix::Set
                          (local_e0,(this->m_vwGlyphIDs).
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar8],local_f8,0,
                           pGVar5,local_ec,(int)local_70,bVar2,false,&lnfNew);
              }
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"component","");
              iVar3 = GrcSymbolTableEntry::FieldIndex(this_00,&local_b0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1
                               );
              }
              if (-1 < iVar3) {
                wGlyphID = (this->m_vwGlyphIDs).
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar8];
                psymComponent = GrcSymbolTableEntry::BaseLigComponent(this_00->m_psymGeneric);
                GrcLigComponentList::AddComponentFor(local_78,wGlyphID,psymComponent,local_80);
              }
              *igid = *igid + 1;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)lnfOld.m_staFile._M_dataplus._M_p != &lnfOld.m_staFile.field_2) {
                operator_delete(lnfOld.m_staFile._M_dataplus._M_p,
                                CONCAT71(lnfOld.m_staFile.field_2._M_allocated_capacity._1_7_,
                                         lnfOld.m_staFile.field_2._M_local_buf[0]) + 1);
              }
            }
            uVar8 = uVar8 + 1;
            puVar6 = (this->m_vwGlyphIDs).
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start;
          } while (uVar8 < (ulong)((long)(this->m_vwGlyphIDs).
                                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6
                                  >> 1));
        }
        vpglfaAttrs = local_90;
        uVar8 = local_88;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)lnfNew.m_staFile._M_dataplus._M_p != &lnfNew.m_staFile.field_2) {
          operator_delete(lnfNew.m_staFile._M_dataplus._M_p,
                          lnfNew.m_staFile.field_2._M_allocated_capacity + 1);
          vpglfaAttrs = local_90;
          uVar8 = local_88;
        }
      }
      uVar8 = uVar8 + 1;
      ppGVar4 = (vpglfaAttrs->
                super__Vector_base<GdlGlyphAttrSetting_*,_std::allocator<GdlGlyphAttrSetting_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(vpglfaAttrs->
                                   super__Vector_base<GdlGlyphAttrSetting_*,_std::allocator<GdlGlyphAttrSetting_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar4 >> 3)
            );
  }
  return;
}

Assistant:

void GdlGlyphDefn::AssignGlyphAttrsToClassMembers(GrcGlyphAttrMatrix * pgax,
	GdlRenderer * prndr, GrcLigComponentList * plclist,
	std::vector<GdlGlyphAttrSetting *> & vpglfaAttrs, int cgid, int & igid)
{
	int igidInitial = igid;

	//	For each attribute assignment in the value list:
	for (size_t ipglfa = 0; ipglfa < vpglfaAttrs.size(); ipglfa++)
	{
		Symbol psym = vpglfaAttrs[ipglfa]->GlyphSymbol();
		Assert(!psym->IsGeneric());
		int nGlyphAttrID = psym->InternalID();

		if (!g_cman.OffsetAttrs() && psym->IsIgnorableOffsetAttr())
			continue;

		//	The new attribute assignment:
		GdlAssignment * pasgnValue = vpglfaAttrs[ipglfa]->Assignment();
		GdlExpression * pexpNew = pasgnValue->Expression();
		int nPRNew = pasgnValue->PointRadius();
		int mPrUnitsNew = pasgnValue->PointRadiusUnits();
		bool fOverrideNew = pasgnValue->Override();
		GrpLineAndFile lnfNew = pasgnValue->LineAndFile();
		int nStmtNoNew = lnfNew.PreProcessedLine();

		GdlClassMemberExpression * pexpilNew = dynamic_cast<GdlClassMemberExpression *>(pexpNew);
		if (pexpilNew)
		{
			Assert(pexpilNew->Name()->FitsSymbolType(ksymtClass));
			pexpilNew->SetClassSize(cgid);
			if (pexpilNew->GlyphIndex() != -1 && pexpilNew->GlyphIndex() != igid)
			{
				//	Make a copy for this specific glyph definition.
				GdlClassMemberExpression * pexpilThisGlyphId 
					= dynamic_cast<GdlClassMemberExpression *>(pexpilNew->Clone());
				pexpilNew = pexpilThisGlyphId;
				pexpNew = dynamic_cast<GdlExpression *>(pexpilNew);
				g_cman.StoreModifiedExpression(pexpNew);
			}
			pexpilNew->SetGlyphIndex(igid);
		}

		igid = igidInitial;	// start over for each attribute

		//	For each glyph ID covered by this definition's range:
		for (size_t iwGlyphID = 0; iwGlyphID < m_vwGlyphIDs.size(); iwGlyphID++)
		{
			if (m_vwGlyphIDs[iwGlyphID] == kBadGlyph) // invalid glyph
				continue;

			//	Compare the new assignment with the previous.
			GdlExpression * pexpOld;
			int nPROld;
			int mPrUnitsOld;
			bool fOverrideOld, fShadow;
			GrpLineAndFile lnfOld;
			pgax->Get(m_vwGlyphIDs[iwGlyphID], nGlyphAttrID,
				&pexpOld, &nPROld, &mPrUnitsOld, &fOverrideOld, &fShadow, &lnfOld);
			int nStmtNoOld = lnfOld.PreProcessedLine();
			Assert(!fShadow);

			if (pexpOld == NULL ||
				(nStmtNoNew > nStmtNoOld && fOverrideNew) ||
				(nStmtNoOld > nStmtNoNew && !fOverrideOld))
			{
				// For indexed-lookup expressions, we need to make a separate copy 
				// for each individual glyph ID.
				GdlExpression * pexpThisGlyphId = pexpNew;
				if (pexpilNew && pexpilNew->GlyphIndex() != igid)
				{
					//	Make a copy for this specific glyph ID.
					pexpThisGlyphId = pexpNew->Clone();
					GdlClassMemberExpression * pexpilThisGlyphId 
						= dynamic_cast<GdlClassMemberExpression *>(pexpThisGlyphId);
					pexpilThisGlyphId->SetGlyphIndex(igid);
					g_cman.StoreModifiedExpression(pexpThisGlyphId);
				}

				//	The current attribute assignment overrides the previous--set it.
				pgax->Set(m_vwGlyphIDs[iwGlyphID], nGlyphAttrID,
					pexpThisGlyphId, nPRNew, mPrUnitsNew, fOverrideNew, false, lnfNew);
			}

			//	If this glyph is a ligature, add the given component to its list.
			int ivComponent = psym->FieldIndex("component");
			if (ivComponent > -1)
			{
				plclist->AddComponentFor(m_vwGlyphIDs[iwGlyphID],
					psym->Generic()->BaseLigComponent(), prndr);
			}

			igid++;
		}
	}
}